

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

ctmbstr prvTidytidyErrorCodeAsKey(uint code)

{
  uint local_18;
  uint i;
  uint code_local;
  
  local_18 = 0;
  while( true ) {
    if (tidyStringsKeys[local_18].key == (ctmbstr)0x0) {
      return "UNDEFINED";
    }
    if (tidyStringsKeys[local_18].value == code) break;
    local_18 = local_18 + 1;
  }
  return tidyStringsKeys[local_18].key;
}

Assistant:

ctmbstr TY_(tidyErrorCodeAsKey)(uint code)
{
    uint i = 0;
    while (tidyStringsKeys[i].key) {
        if ( tidyStringsKeys[i].value == code )
            return tidyStringsKeys[i].key;
        i++;
    }
    return "UNDEFINED";
}